

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<long,long>(Thread *this,BinopFunc<long,_long> *f)

{
  Simd<long,_(unsigned_char)__x02_> value;
  long *plVar1;
  long lVar2;
  byte local_49;
  undefined1 auStack_48 [7];
  u8 i;
  SR result;
  Simd<long,_(unsigned_char)__x02_> lhs;
  Simd<long,_(unsigned_char)__x02_> rhs;
  BinopFunc<long,_long> *f_local;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<long,(unsigned_char)2>>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<long,(unsigned_char)2>>(this);
  for (local_49 = 0; local_49 < 2; local_49 = local_49 + 1) {
    plVar1 = Simd<long,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<long,_(unsigned_char)__x02_> *)(result.v + 1),local_49);
    lVar2 = *plVar1;
    plVar1 = Simd<long,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<long,_(unsigned_char)__x02_> *)(lhs.v + 1),local_49);
    lVar2 = (*f)(lVar2,*plVar1);
    plVar1 = Simd<long,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<long,_(unsigned_char)__x02_> *)auStack_48,local_49);
    *plVar1 = lVar2;
  }
  value.v[1] = result.v[0];
  value.v[0] = _auStack_48;
  Push<wabt::interp::Simd<long,(unsigned_char)2>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}